

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cio.c
# Opt level: O0

OPJ_OFF_T opj_stream_read_skip
                    (opj_stream_private_t *p_stream,OPJ_OFF_T p_size,opj_event_mgr_t *p_event_mgr)

{
  OPJ_OFF_T OVar1;
  OPJ_OFF_T local_50;
  long local_48;
  opj_stream_private_t *local_40;
  OPJ_OFF_T l_current_skip_nb_bytes;
  OPJ_OFF_T l_skip_nb_bytes;
  opj_event_mgr_t *p_event_mgr_local;
  OPJ_OFF_T p_size_local;
  opj_stream_private_t *p_stream_local;
  
  l_current_skip_nb_bytes = 0;
  if (p_size < 0) {
    __assert_fail("p_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/cio.c"
                  ,0x1d5,
                  "OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t *, OPJ_OFF_T, opj_event_mgr_t *)"
                 );
  }
  if (p_stream->m_bytes_in_buffer < (ulong)p_size) {
    if ((p_stream->m_status & 4) == 0) {
      p_event_mgr_local = (opj_event_mgr_t *)p_size;
      if (p_stream->m_bytes_in_buffer != 0) {
        l_current_skip_nb_bytes = p_stream->m_bytes_in_buffer;
        p_stream->m_current_data = p_stream->m_stored_data;
        p_event_mgr_local = (opj_event_mgr_t *)(p_size - p_stream->m_bytes_in_buffer);
        p_stream->m_bytes_in_buffer = 0;
      }
      for (; 0 < (long)p_event_mgr_local;
          p_event_mgr_local = (opj_event_mgr_t *)((long)p_event_mgr_local - OVar1)) {
        if (p_stream->m_user_data_length <
            (ulong)((long)&p_event_mgr_local->m_error_data +
                   p_stream->m_byte_offset + l_current_skip_nb_bytes)) {
          opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
          p_stream->m_byte_offset = l_current_skip_nb_bytes + p_stream->m_byte_offset;
          local_48 = p_stream->m_user_data_length - p_stream->m_byte_offset;
          opj_stream_read_seek(p_stream,p_stream->m_user_data_length,p_event_mgr);
          p_stream->m_status = p_stream->m_status | 4;
          if (local_48 == 0) {
            local_48 = -1;
          }
          return local_48;
        }
        OVar1 = (*p_stream->m_skip_fn)((OPJ_OFF_T)p_event_mgr_local,p_stream->m_user_data);
        if (OVar1 == -1) {
          opj_event_msg(p_event_mgr,4,"Stream reached its end !\n");
          p_stream->m_status = p_stream->m_status | 4;
          p_stream->m_byte_offset = l_current_skip_nb_bytes + p_stream->m_byte_offset;
          if (l_current_skip_nb_bytes == 0) {
            local_50 = -1;
          }
          else {
            local_50 = l_current_skip_nb_bytes;
          }
          return local_50;
        }
        l_current_skip_nb_bytes = OVar1 + l_current_skip_nb_bytes;
      }
      p_stream->m_byte_offset = l_current_skip_nb_bytes + p_stream->m_byte_offset;
      p_stream_local = (opj_stream_private_t *)l_current_skip_nb_bytes;
    }
    else {
      local_40 = (opj_stream_private_t *)p_stream->m_bytes_in_buffer;
      p_stream->m_current_data = p_stream->m_current_data + p_stream->m_bytes_in_buffer;
      p_stream->m_bytes_in_buffer = 0;
      p_stream->m_byte_offset = (long)&local_40->m_user_data + p_stream->m_byte_offset;
      if (local_40 == (opj_stream_private_t *)0x0) {
        local_40 = (opj_stream_private_t *)0xffffffffffffffff;
      }
      p_stream_local = local_40;
    }
  }
  else {
    p_stream->m_current_data = p_stream->m_current_data + p_size;
    p_stream->m_bytes_in_buffer = p_stream->m_bytes_in_buffer - p_size;
    p_stream->m_byte_offset = p_size + p_stream->m_byte_offset;
    p_stream_local = (opj_stream_private_t *)p_size;
  }
  return (OPJ_OFF_T)p_stream_local;
}

Assistant:

OPJ_OFF_T opj_stream_read_skip(opj_stream_private_t * p_stream,
                               OPJ_OFF_T p_size, opj_event_mgr_t * p_event_mgr)
{
    OPJ_OFF_T l_skip_nb_bytes = 0;
    OPJ_OFF_T l_current_skip_nb_bytes = 0;

    assert(p_size >= 0);

    if (p_stream->m_bytes_in_buffer >= (OPJ_SIZE_T)p_size) {
        p_stream->m_current_data += p_size;
        /* it is safe to cast p_size to OPJ_SIZE_T since it is <= m_bytes_in_buffer
        which is of type OPJ_SIZE_T */
        p_stream->m_bytes_in_buffer -= (OPJ_SIZE_T)p_size;
        l_skip_nb_bytes += p_size;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes;
    }

    /* we are now in the case when the remaining data if not sufficient */
    if (p_stream->m_status & OPJ_STREAM_STATUS_END) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data += p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
        p_stream->m_byte_offset += l_skip_nb_bytes;
        return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
    }

    /* the flag is not set, we copy data and then do an actual skip on the stream */
    if (p_stream->m_bytes_in_buffer) {
        l_skip_nb_bytes += (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_current_data = p_stream->m_stored_data;
        p_size -= (OPJ_OFF_T)p_stream->m_bytes_in_buffer;
        p_stream->m_bytes_in_buffer = 0;
    }

    while (p_size > 0) {
        /* Check if we are going beyond the end of file. Most skip_fn do not */
        /* check that, but we must be careful not to advance m_byte_offset */
        /* beyond m_user_data_length, otherwise */
        /* opj_stream_get_number_byte_left() will assert. */
        if ((OPJ_UINT64)(p_stream->m_byte_offset + l_skip_nb_bytes + p_size) >
                p_stream->m_user_data_length) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_byte_offset += l_skip_nb_bytes;
            l_skip_nb_bytes = (OPJ_OFF_T)(p_stream->m_user_data_length -
                                          (OPJ_UINT64)p_stream->m_byte_offset);

            opj_stream_read_seek(p_stream, (OPJ_OFF_T)p_stream->m_user_data_length,
                                 p_event_mgr);
            p_stream->m_status |= OPJ_STREAM_STATUS_END;

            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }

        /* we should do an actual skip on the media */
        l_current_skip_nb_bytes = p_stream->m_skip_fn(p_size, p_stream->m_user_data);
        if (l_current_skip_nb_bytes == (OPJ_OFF_T) - 1) {
            opj_event_msg(p_event_mgr, EVT_INFO, "Stream reached its end !\n");

            p_stream->m_status |= OPJ_STREAM_STATUS_END;
            p_stream->m_byte_offset += l_skip_nb_bytes;
            /* end if stream */
            return l_skip_nb_bytes ? l_skip_nb_bytes : (OPJ_OFF_T) - 1;
        }
        p_size -= l_current_skip_nb_bytes;
        l_skip_nb_bytes += l_current_skip_nb_bytes;
    }

    p_stream->m_byte_offset += l_skip_nb_bytes;

    return l_skip_nb_bytes;
}